

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnetfil.cpp
# Opt level: O0

int __thiscall
CVmNetFile::get_file_mode
          (CVmNetFile *this,unsigned_long *mode,unsigned_long *attrs,int follow_links)

{
  int iVar1;
  long *in_RSI;
  CVmNetFile *in_RDI;
  int ret;
  char *in_stack_00000138;
  char *in_stack_00000140;
  undefined4 local_20;
  
  iVar1 = is_net_file(in_RDI);
  if (iVar1 == 0) {
    local_20 = osfmode((char *)this,mode._4_4_,attrs,(unsigned_long *)CONCAT44(follow_links,ret));
  }
  else {
    local_20 = server_file_check(in_stack_00000140,in_stack_00000138);
    iVar1 = 0;
    if (local_20 != 0) {
      iVar1 = 0x8000;
    }
    *in_RSI = (long)iVar1;
  }
  return local_20;
}

Assistant:

int CVmNetFile::get_file_mode(
    VMG_ unsigned long *mode, unsigned long *attrs, int follow_links)
{
    /* 
     *   if it's a network file, check with the server to see if the file
     *   exists; otherwise check the local file system 
     */
    int ret;
    if (is_net_file())
    {
        /* 
         *   network file - if the file exists, it's simply a regular file,
         *   since that's all we support 
         */
        ret = server_file_check(vmg_ srvfname, "R");
        *mode = (ret ? OSFMODE_FILE : 0);
    }
    else
    {
        /* local file - get the local file mode */
        ret = osfmode(lclfname, follow_links, mode, attrs);
    }
    
    /* return the result */
    return ret;
}